

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

LogicalExpr * __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>
::ReadLogicalExpr_abi_cxx11_
          (LogicalExpr *__return_storage_ptr__,
          NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>
          *this,int opcode)

{
  Kind KVar1;
  char *pcVar2;
  int iVar3;
  OpCodeInfo *pOVar4;
  BinaryReaderBase *this_00;
  LogicalExpr *this_01;
  LogicalExpr *__return_storage_ptr___00;
  NumericExpr lhs;
  string local_1b8 [32];
  LogicalExpr else_expr;
  LogicalExpr then_expr;
  string local_158 [32];
  string local_138 [32];
  LogicalExpr local_118;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  CountExpr local_98;
  string local_78 [32];
  string local_58 [32];
  LogicalExpr local_38;
  
  __return_storage_ptr___00 = &lhs;
  pOVar4 = GetOpCodeInfo(opcode);
  KVar1 = pOVar4->first_kind;
  switch(KVar1) {
  case ATLEAST:
    ReadNumericExpr_abi_cxx11_(&lhs,this,false);
    this_00 = *(BinaryReaderBase **)this;
    pcVar2 = (this_00->super_ReaderBase).ptr_;
    (this_00->super_ReaderBase).token_ = pcVar2;
    (this_00->super_ReaderBase).ptr_ = pcVar2 + 1;
    if (*pcVar2 == 'o') {
      iVar3 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
              ::ReadOpCode((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                            *)this);
      pOVar4 = GetOpCodeInfo(iVar3);
      if (pOVar4->kind != COUNT) {
        this_00 = *(BinaryReaderBase **)this;
        goto LAB_00193198;
      }
    }
    else {
LAB_00193198:
      BinaryReaderBase::ReportError<>(this_00,(CStringRef)0x213782);
    }
    std::__cxx11::string::string((string *)&local_118,(string *)&lhs);
    ReadCountExpr_abi_cxx11_(&local_98,this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::~string((string *)&local_98);
    this_01 = &local_118;
    break;
  case IMPLICATION:
    ReadLogicalExpr_abi_cxx11_(&lhs,this);
    ReadLogicalExpr_abi_cxx11_(&then_expr,this);
    ReadLogicalExpr_abi_cxx11_(&else_expr,this);
    std::__cxx11::string::string(local_138,(string *)&lhs);
    std::__cxx11::string::string(local_158,(string *)&then_expr);
    std::__cxx11::string::string(local_b8,(string *)&else_expr);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string((string *)&else_expr);
    this_01 = &then_expr;
    break;
  case EXISTS:
    iVar3 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
            ::ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                           *)this,3);
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>::LogicalExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar3,(ArgHandler *)&lhs);
    goto LAB_00193327;
  case ALLDIFF:
    iVar3 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
            ::ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                           *)this,1);
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar3,(ArgHandler *)&lhs);
    goto LAB_00193327;
  default:
    if (KVar1 == FIRST_RELATIONAL) {
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
      ::
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::NumericExprReader>
      ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::NumericExprReader>
                         *)&lhs,(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                                 *)this);
      std::__cxx11::string::string(local_f8,(string *)&lhs);
      std::__cxx11::string::string(local_78,local_1b8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_f8);
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
      ::
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::NumericExprReader>
      ::~BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::NumericExprReader>
                          *)&lhs);
      return __return_storage_ptr__;
    }
    if (KVar1 == FIRST_BINARY_LOGICAL) {
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
      ::
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::LogicalExprReader>
      ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::LogicalExprReader>
                         *)&lhs,(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                                 *)this);
      std::__cxx11::string::string(local_d8,(string *)&lhs);
      std::__cxx11::string::string(local_58,local_1b8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_d8);
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
      ::
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::LogicalExprReader>
      ::~BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::LogicalExprReader>
                          *)&lhs);
      return __return_storage_ptr__;
    }
    if (KVar1 == NOT) {
      __return_storage_ptr___00 = &local_38;
      ReadLogicalExpr_abi_cxx11_(__return_storage_ptr___00,this);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      goto LAB_001932eb;
    }
  case ATMOST:
  case EXACTLY:
  case NOT_ATLEAST:
  case NOT_ATMOST:
  case LAST_LOGICAL_COUNT:
  case FORALL:
    BinaryReaderBase::ReportError<>(*(BinaryReaderBase **)this,(CStringRef)0x2151e2);
LAB_00193327:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_001932eb:
  std::__cxx11::string::~string((string *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}